

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermPartialOrdering.cpp
# Opt level: O3

TermPartialOrdering *
Kernel::TermPartialOrdering::set(TermPartialOrdering *tpo,TermOrderingConstraint con)

{
  bool bVar1;
  TermPartialOrdering *this;
  TermPartialOrdering **local_50;
  TermPartialOrdering *local_48;
  tuple<const_Kernel::TermPartialOrdering_*,_Kernel::TermList,_Kernel::TermList,_Kernel::Ordering::Result>
  local_40;
  
  if (set(Kernel::TermPartialOrdering_const*,Kernel::TermOrderingConstraint)::cache == '\0') {
    set();
  }
  local_40.
  super__Tuple_impl<0UL,_const_Kernel::TermPartialOrdering_*,_Kernel::TermList,_Kernel::TermList,_Kernel::Ordering::Result>
  .super__Tuple_impl<1UL,_Kernel::TermList,_Kernel::TermList,_Kernel::Ordering::Result>.
  super__Tuple_impl<2UL,_Kernel::TermList,_Kernel::Ordering::Result>.
  super__Tuple_impl<3UL,_Kernel::Ordering::Result>.
  super__Head_base<3UL,_Kernel::Ordering::Result,_false>._M_head_impl =
       (_Head_base<3UL,_Kernel::Ordering::Result,_false>)
       (_Head_base<3UL,_Kernel::Ordering::Result,_false>)con.rel;
  local_40.
  super__Tuple_impl<0UL,_const_Kernel::TermPartialOrdering_*,_Kernel::TermList,_Kernel::TermList,_Kernel::Ordering::Result>
  .super__Tuple_impl<1UL,_Kernel::TermList,_Kernel::TermList,_Kernel::Ordering::Result>.
  super__Head_base<1UL,_Kernel::TermList,_false>._M_head_impl._content._0_4_ = (int)con.lhs._content
  ;
  local_40.
  super__Tuple_impl<0UL,_const_Kernel::TermPartialOrdering_*,_Kernel::TermList,_Kernel::TermList,_Kernel::Ordering::Result>
  .super__Tuple_impl<1UL,_Kernel::TermList,_Kernel::TermList,_Kernel::Ordering::Result>.
  super__Tuple_impl<2UL,_Kernel::TermList,_Kernel::Ordering::Result>.
  super__Head_base<2UL,_Kernel::TermList,_false>._M_head_impl._content = con.rhs._content;
  local_40.
  super__Tuple_impl<0UL,_const_Kernel::TermPartialOrdering_*,_Kernel::TermList,_Kernel::TermList,_Kernel::Ordering::Result>
  .super__Tuple_impl<1UL,_Kernel::TermList,_Kernel::TermList,_Kernel::Ordering::Result>.
  super__Head_base<1UL,_Kernel::TermList,_false>._M_head_impl._content._4_4_ =
       con.lhs._content._4_4_;
  local_48 = (TermPartialOrdering *)0x0;
  local_40.
  super__Tuple_impl<0UL,_const_Kernel::TermPartialOrdering_*,_Kernel::TermList,_Kernel::TermList,_Kernel::Ordering::Result>
  .super__Head_base<0UL,_const_Kernel::TermPartialOrdering_*,_false>._M_head_impl = tpo;
  bVar1 = Lib::
          DHMap<std::tuple<const_Kernel::TermPartialOrdering_*,_Kernel::TermList,_Kernel::TermList,_Kernel::Ordering::Result>,_const_Kernel::TermPartialOrdering_*,_Lib::DefaultHash,_Lib::DefaultHash2>
          ::getValuePtr(&set::cache,&local_40,&local_50,&local_48);
  if (bVar1) {
    this = (TermPartialOrdering *)::operator_new(0x30);
    this->_ord = tpo->_ord;
    Lib::Map<Kernel::TermList,_unsigned_long,_Lib::DefaultHash>::Map(&this->_nodes,&tpo->_nodes);
    this->_po = tpo->_po;
    bVar1 = set(this,con);
    if (bVar1) {
      *local_50 = this;
    }
    else {
      Lib::Map<Kernel::TermList,_unsigned_long,_Lib::DefaultHash>::clear(&this->_nodes);
      operator_delete(this,0x30);
      *local_50 = (TermPartialOrdering *)0x0;
    }
  }
  return *local_50;
}

Assistant:

const TermPartialOrdering* TermPartialOrdering::set(const TermPartialOrdering* tpo, TermOrderingConstraint con)
{
  static DHMap<std::tuple<const TermPartialOrdering*, TermList, TermList, Result>, const TermPartialOrdering*> cache;
  const TermPartialOrdering** ptr;
  if (cache.getValuePtr(make_tuple(tpo, con.lhs, con.rhs, con.rel), ptr, nullptr)) {
    auto res = new TermPartialOrdering(*tpo);
    if (!res->set(con)) {
      delete res;
      *ptr = nullptr;
    } else {
      *ptr = res;
    }
  }
  return *ptr;
}